

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtIntersectXor(word *pOut,int fComp,word *pIn0,word *pIn1,int fComp01,int nWords)

{
  int local_3c;
  int w;
  int nWords_local;
  int fComp01_local;
  word *pIn1_local;
  word *pIn0_local;
  int fComp_local;
  word *pOut_local;
  
  if (fComp01 == 0) {
    if (fComp == 0) {
      for (local_3c = 0; local_3c < nWords; local_3c = local_3c + 1) {
        if (((pIn0[local_3c] ^ pIn1[local_3c]) & pOut[local_3c]) != 0) {
          return 1;
        }
      }
    }
    else {
      for (local_3c = 0; local_3c < nWords; local_3c = local_3c + 1) {
        if (((pIn0[local_3c] ^ pIn1[local_3c]) & (pOut[local_3c] ^ 0xffffffffffffffff)) != 0) {
          return 1;
        }
      }
    }
  }
  else if (fComp == 0) {
    for (local_3c = 0; local_3c < nWords; local_3c = local_3c + 1) {
      if (((pIn0[local_3c] ^ pIn1[local_3c] ^ 0xffffffffffffffff) & pOut[local_3c]) != 0) {
        return 1;
      }
    }
  }
  else {
    for (local_3c = 0; local_3c < nWords; local_3c = local_3c + 1) {
      if (((pIn0[local_3c] ^ pIn1[local_3c] ^ 0xffffffffffffffff) &
          (pOut[local_3c] ^ 0xffffffffffffffff)) != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static inline int Abc_TtIntersectXor( word * pOut, int fComp, word * pIn0, word * pIn1, int fComp01, int nWords )
{
    int w;
    if ( fComp01 )
    {
        if ( fComp )
        {
            for ( w = 0; w < nWords; w++ )
                if ( ~(pIn0[w] ^ pIn1[w]) & ~pOut[w] )
                    return 1;
        }
        else 
        {
            for ( w = 0; w < nWords; w++ )
                if ( ~(pIn0[w] ^ pIn1[w]) & pOut[w] )
                    return 1;
        }
    }
    else
    {
        if ( fComp )
        {
            for ( w = 0; w < nWords; w++ )
                if ( (pIn0[w] ^ pIn1[w]) & ~pOut[w] )
                    return 1;
        }
        else 
        {
            for ( w = 0; w < nWords; w++ )
                if ( (pIn0[w] ^ pIn1[w]) & pOut[w] )
                    return 1;
        }
    }
    return 0;
}